

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Cluster::Finalize(Cluster *this,bool set_last_frame_duration,uint64_t duration)

{
  size_t *psVar1;
  Frame *pFVar2;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *pmVar3;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *pmVar4;
  Cluster *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  int32 iVar8;
  _Rb_tree_node_base *p_Var9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  _List_node_base *p_Var12;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  Frame *frame;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  pVar13;
  uint64_t local_60;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *local_58;
  undefined4 local_4c;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_48;
  uint64_t local_40;
  Cluster *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,set_last_frame_duration);
  if ((this->writer_ != (IMkvWriter *)0x0) && (this->finalized_ == false)) {
    local_40 = duration;
    if (this->write_last_frame_with_duration_ == true) {
      local_58 = &this->stored_frames_;
      pmVar3 = &this->stored_frames_;
      local_48 = &this->last_block_timestamp_;
      local_38 = this;
      do {
        this_00 = local_38;
        this = local_38;
        if ((local_38->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
        goto LAB_0014ecb4;
        p_Var9 = (local_38->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        frame = (Frame *)(p_Var9[1]._M_parent)->_M_left;
        while (p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9),
              (_Rb_tree_header *)p_Var9 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
          pFVar2 = (Frame *)(p_Var9[1]._M_parent)->_M_left;
          if (pFVar2->timestamp_ < frame->timestamp_) {
            frame = pFVar2;
          }
        }
        if ((char)local_4c != '\0') {
          local_60 = frame->track_number_;
          pmVar10 = std::
                    map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                    ::operator[](local_58,&local_60);
          if (((pmVar10->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>).
               _M_impl._M_node._M_size == 1) && (frame->duration_set_ == false)) {
            frame->duration_ = local_40 - frame->timestamp_;
            frame->duration_set_ = true;
            if ((frame->is_key_ == false) && (frame->reference_block_timestamp_set_ == false)) {
              local_60 = frame->track_number_;
              pmVar11 = std::
                        map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                        ::operator[](local_48,&local_60);
              frame->reference_block_timestamp_ = *pmVar11;
              frame->reference_block_timestamp_set_ = true;
            }
          }
        }
        bVar5 = DoWriteFrame(this_00,frame);
        pmVar4 = local_58;
        local_60 = frame->track_number_;
        pmVar10 = std::
                  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                  ::operator[](local_58,&local_60);
        p_Var12 = (pmVar10->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>)
                  ._M_impl._M_node.super__List_node_base._M_next;
        psVar1 = &(pmVar10->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>)
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var12);
        local_60 = frame->track_number_;
        p_Var12 = (_List_node_base *)
                  std::
                  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                  ::operator[](pmVar4,&local_60);
        pmVar4 = local_58;
        if ((((_List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)&p_Var12->_M_next
             )->_M_impl)._M_node.super__List_node_base._M_next == p_Var12) {
          local_60 = frame->track_number_;
          pVar13 = std::
                   _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                   ::equal_range(&local_58->_M_t,&local_60);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
          ::_M_erase_aux(&pmVar4->_M_t,(_Base_ptr)pVar13.first._M_node,
                         (_Base_ptr)pVar13.second._M_node);
        }
        Frame::~Frame(frame);
        operator_delete(frame);
      } while (bVar5);
    }
    else {
LAB_0014ecb4:
      if (this->size_position_ != -1) {
        iVar6 = (*this->writer_->_vptr_IMkvWriter[3])();
        if ((char)iVar6 != '\0') {
          iVar6 = (*this->writer_->_vptr_IMkvWriter[1])();
          iVar7 = (*this->writer_->_vptr_IMkvWriter[2])(this->writer_,this->size_position_);
          if (iVar7 != 0) {
            return false;
          }
          iVar8 = WriteUIntSize(this->writer_,this->payload_size_,8);
          if (iVar8 != 0) {
            return false;
          }
          iVar6 = (*this->writer_->_vptr_IMkvWriter[2])(this->writer_,CONCAT44(extraout_var,iVar6));
          if (iVar6 != 0) {
            return false;
          }
        }
        this->finalized_ = true;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Cluster::Finalize(bool set_last_frame_duration, uint64_t duration) {
  if (!writer_ || finalized_)
    return false;

  if (write_last_frame_with_duration_) {
    // Write out held back Frames. This essentially performs a k-way merge
    // across all tracks in the increasing order of timestamps.
    while (!stored_frames_.empty()) {
      Frame* frame = stored_frames_.begin()->second.front();

      // Get the next frame to write (frame with least timestamp across all
      // tracks).
      for (FrameMapIterator frames_iterator = ++stored_frames_.begin();
           frames_iterator != stored_frames_.end(); ++frames_iterator) {
        if (frames_iterator->second.front()->timestamp() < frame->timestamp()) {
          frame = frames_iterator->second.front();
        }
      }

      // Set the duration if it's the last frame for the track.
      if (set_last_frame_duration &&
          stored_frames_[frame->track_number()].size() == 1 &&
          !frame->duration_set()) {
        frame->set_duration(duration - frame->timestamp());
        if (!frame->is_key() && !frame->reference_block_timestamp_set()) {
          frame->set_reference_block_timestamp(
              last_block_timestamp_[frame->track_number()]);
        }
      }

      // Write the frame and remove it from |stored_frames_|.
      const bool wrote_frame = DoWriteFrame(frame);
      stored_frames_[frame->track_number()].pop_front();
      if (stored_frames_[frame->track_number()].empty()) {
        stored_frames_.erase(frame->track_number());
      }
      delete frame;
      if (!wrote_frame)
        return false;
    }
  }

  if (size_position_ == -1)
    return false;

  if (writer_->Seekable()) {
    const int64_t pos = writer_->Position();

    if (writer_->Position(size_position_))
      return false;

    if (WriteUIntSize(writer_, payload_size(), 8))
      return false;

    if (writer_->Position(pos))
      return false;
  }

  finalized_ = true;

  return true;
}